

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::FragDepthCompareCase::iterate(FragDepthCompareCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  int *piVar9;
  NotSupportedError *this_00;
  TestError *pTVar10;
  int iVar11;
  char *description;
  long lVar12;
  int y;
  int x;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  allocator<char> local_2ee;
  allocator<char> local_2ed;
  int local_2ec;
  undefined1 local_2e8 [32];
  TestLog *local_2c8;
  Surface referenceFrame;
  float constDepthCoord [16];
  float varyingDepthCoord [16];
  string local_220;
  Surface renderedFrame;
  ShaderProgram basicQuadProgram;
  VertexArrayBinding posBinding;
  VertexArrayBinding local_c8;
  Random rnd;
  long lVar8;
  undefined4 extraout_var_00;
  
  local_2c8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar6);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar9 = (int *)CONCAT44(extraout_var_00,iVar5);
  iVar5 = *piVar9;
  iVar14 = 0x80;
  if (iVar5 < 0x80) {
    iVar14 = iVar5;
  }
  iVar11 = 0x80;
  if (piVar9[1] < 0x80) {
    iVar11 = piVar9[1];
  }
  iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5 - iVar14);
  local_2ec = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar9[1] - iVar11);
  tcu::Surface::Surface(&renderedFrame,iVar14,iVar11);
  tcu::Surface::Surface(&referenceFrame,iVar14,iVar11);
  if (piVar9[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x8a);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar8 + 0x1a00))(iVar5,local_2ec,iVar14,iVar11);
  (**(code **)(lVar8 + 0x188))(0x4500);
  (**(code **)(lVar8 + 0x5e0))(0xb71);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)constDepthCoord,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)varyingDepthCoord,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,(allocator<char> *)&local_220);
  glu::makeVtxFragSources
            ((ProgramSources *)&posBinding,(string *)constDepthCoord,(string *)varyingDepthCoord);
  glu::ShaderProgram::ShaderProgram(&basicQuadProgram,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)varyingDepthCoord);
  std::__cxx11::string::~string((string *)constDepthCoord);
  if (basicQuadProgram.m_program.m_info.linkOk == false) {
    glu::operator<<(local_2c8,&basicQuadProgram);
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x99);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  constDepthCoord[0xc] = 0.0;
  constDepthCoord[0xd] = 1.0;
  constDepthCoord[0xe] = 0.1;
  constDepthCoord[0xf] = 1.0;
  constDepthCoord[8] = 0.0;
  constDepthCoord[9] = -1.0;
  constDepthCoord[10] = 0.1;
  constDepthCoord[0xb] = 1.0;
  constDepthCoord[4] = -1.0;
  constDepthCoord[5] = 1.0;
  constDepthCoord[6] = 0.1;
  constDepthCoord[7] = 1.0;
  constDepthCoord[0] = -1.0;
  constDepthCoord[1] = -1.0;
  constDepthCoord[2] = 0.1;
  constDepthCoord[3] = 1.0;
  varyingDepthCoord[0xc] = 1.0;
  varyingDepthCoord[0xd] = 1.0;
  varyingDepthCoord[0xe] = -1.0;
  varyingDepthCoord[0xf] = 1.0;
  varyingDepthCoord[8] = 1.0;
  varyingDepthCoord[9] = -1.0;
  varyingDepthCoord[10] = 0.0;
  varyingDepthCoord[0xb] = 1.0;
  varyingDepthCoord[4] = 0.0;
  varyingDepthCoord[5] = 1.0;
  varyingDepthCoord[6] = 0.0;
  varyingDepthCoord[7] = 1.0;
  varyingDepthCoord[0] = 0.0;
  varyingDepthCoord[1] = -1.0;
  varyingDepthCoord[2] = 1.0;
  varyingDepthCoord[3] = 1.0;
  (**(code **)(lVar8 + 0x1680))(basicQuadProgram.m_program.m_program);
  pcVar2 = *(code **)(lVar8 + 0x15a0);
  uVar7 = (**(code **)(lVar8 + 0xb48))(basicQuadProgram.m_program.m_program,"u_color");
  (*pcVar2)(0,0,0x3f800000,0x3f800000,uVar7);
  (**(code **)(lVar8 + 0x4a0))(0x207);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e8,"a_position",(allocator<char> *)&local_220);
  glu::va::Float(&posBinding,(string *)local_2e8,4,4,0,constDepthCoord);
  std::__cxx11::string::~string((string *)local_2e8);
  local_2e8._0_8_ = (pointer)0x600000000;
  local_2e8._8_4_ = INDEXTYPE_UINT16;
  local_2e8._16_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,basicQuadProgram.m_program.m_program,1,
            &posBinding,(PrimitiveList *)local_2e8,(DrawUtilCallback *)0x0);
  std::__cxx11::string::~string((string *)&posBinding.binding.name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e8,"a_position",(allocator<char> *)&local_220);
  glu::va::Float(&posBinding,(string *)local_2e8,4,4,0,varyingDepthCoord);
  std::__cxx11::string::~string((string *)local_2e8);
  local_2e8._0_8_ = (pointer)0x600000000;
  local_2e8._8_4_ = INDEXTYPE_UINT16;
  local_2e8._16_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,basicQuadProgram.m_program.m_program,1,
            &posBinding,(PrimitiveList *)local_2e8,(DrawUtilCallback *)0x0);
  std::__cxx11::string::~string((string *)&posBinding.binding.name);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Draw base quads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0xbb);
  glu::ShaderProgram::~ShaderProgram(&basicQuadProgram);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)constDepthCoord,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)varyingDepthCoord,(this->m_fragSrc)._M_dataplus._M_p,
             (allocator<char> *)&local_220);
  glu::makeVtxFragSources
            ((ProgramSources *)&posBinding,(string *)constDepthCoord,(string *)varyingDepthCoord);
  glu::ShaderProgram::ShaderProgram(&basicQuadProgram,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)varyingDepthCoord);
  std::__cxx11::string::~string((string *)constDepthCoord);
  glu::operator<<(local_2c8,&basicQuadProgram);
  if (basicQuadProgram.m_program.m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0xc4);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  varyingDepthCoord[4] = 1.0;
  varyingDepthCoord[5] = 0.0;
  varyingDepthCoord[6] = 1.0;
  varyingDepthCoord[7] = 1.0;
  varyingDepthCoord[0] = 0.0;
  varyingDepthCoord[1] = 0.0;
  varyingDepthCoord[2] = 0.0;
  varyingDepthCoord[3] = 1.0;
  constDepthCoord[0xc] = 1.0;
  constDepthCoord[0xd] = 1.0;
  constDepthCoord[0xe] = -1.0;
  constDepthCoord[0xf] = 1.0;
  constDepthCoord[8] = 1.0;
  constDepthCoord[9] = -1.0;
  constDepthCoord[10] = 0.0;
  constDepthCoord[0xb] = 1.0;
  constDepthCoord[4] = -1.0;
  constDepthCoord[5] = 1.0;
  constDepthCoord[6] = 0.0;
  constDepthCoord[7] = 1.0;
  constDepthCoord[0] = -1.0;
  constDepthCoord[1] = -1.0;
  constDepthCoord[2] = 1.0;
  constDepthCoord[3] = 1.0;
  (**(code **)(lVar8 + 0x1680))(basicQuadProgram.m_program.m_program);
  (**(code **)(lVar8 + 0x4a0))(this->m_compareFunc);
  pcVar2 = *(code **)(lVar8 + 0x15a0);
  uVar7 = (**(code **)(lVar8 + 0xb48))(basicQuadProgram.m_program.m_program,"u_color");
  (*pcVar2)(0,0x3f800000,0,0x3f800000,uVar7);
  deqp::gls::setupDefaultUniforms
            (((this->super_TestCase).m_context)->m_renderCtx,basicQuadProgram.m_program.m_program);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2e8,"a_position",&local_2ed);
  glu::va::Float(&posBinding,(string *)local_2e8,4,4,0,constDepthCoord);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"a_coord",&local_2ee);
  glu::va::Float(&local_c8,&local_220,2,4,0,varyingDepthCoord);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)local_2e8);
  local_2e8._0_8_ = (pointer)0x600000000;
  local_2e8._8_4_ = INDEXTYPE_UINT16;
  local_2e8._16_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,basicQuadProgram.m_program.m_program,2,
            &posBinding,(PrimitiveList *)local_2e8,(DrawUtilCallback *)0x0);
  lVar12 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&posBinding.binding.type + lVar12));
    lVar12 = lVar12 + -0x50;
  } while (lVar12 != -0x48);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0xe6);
  glu::ShaderProgram::~ShaderProgram(&basicQuadProgram);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&basicQuadProgram,&renderedFrame);
  glu::readPixels(pRVar1,iVar5,local_2ec,(PixelBufferAccess *)&basicQuadProgram);
  for (iVar5 = 0; iVar5 < referenceFrame.m_height; iVar5 = iVar5 + 1) {
    iVar11 = (int)((float)referenceFrame.m_width * 0.5 + 0.5);
    fVar16 = ((float)iVar5 + 0.5) / (float)referenceFrame.m_height;
    iVar14 = referenceFrame.m_width;
    if (iVar11 < referenceFrame.m_width) {
      iVar14 = iVar11;
    }
    iVar13 = 0;
    if (iVar11 < 0) {
      iVar14 = 0;
    }
    iVar11 = 0;
    if (0 < iVar14) {
      iVar11 = iVar14;
    }
    for (; iVar11 != iVar13; iVar13 = iVar13 + 1) {
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = ((float)iVar13 + 0.5) / (float)referenceFrame.m_width
      ;
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = fVar16;
      fVar15 = (*this->m_evalFunc)((Vec2 *)&basicQuadProgram);
      bVar4 = compare<float>(this->m_compareFunc,fVar15,0.55);
      uVar7 = 0xffff0000;
      if (bVar4) {
        uVar7 = 0xff00ff00;
      }
      *(undefined4 *)
       ((long)referenceFrame.m_pixels.m_ptr + (long)(referenceFrame.m_width * iVar5 + iVar13) * 4) =
           uVar7;
    }
    iVar13 = 0;
    for (iVar11 = iVar14; iVar3 = referenceFrame.m_width, iVar11 < referenceFrame.m_width;
        iVar11 = iVar11 + 1) {
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = ((float)iVar11 + 0.5) / (float)referenceFrame.m_width
      ;
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = fVar16;
      fVar15 = (*this->m_evalFunc)((Vec2 *)&basicQuadProgram);
      bVar4 = compare<float>(this->m_compareFunc,fVar15,
                             1.0 - (((float)iVar13 + 0.5) / (float)(iVar3 - iVar14) + fVar16) * 0.5)
      ;
      uVar7 = 0xffff0000;
      if (bVar4) {
        uVar7 = 0xff00ff00;
      }
      *(undefined4 *)
       ((long)referenceFrame.m_pixels.m_ptr + (long)(referenceFrame.m_width * iVar5 + iVar11) * 4) =
           uVar7;
      iVar13 = iVar13 + 1;
    }
  }
  bVar4 = tcu::fuzzyCompare(local_2c8,"Result","Image comparison result",&referenceFrame,
                            &renderedFrame,0.05,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,description
            );
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

FragDepthCompareCase::IterateResult FragDepthCompareCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const float					constDepth		= 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		glu::ShaderProgram basicQuadProgram(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));

		if (!basicQuadProgram.isOk())
		{
			log << basicQuadProgram;
			TCU_FAIL("Compile failed");
		}

		const float constDepthCoord[] =
		{
			-1.0f, -1.0f, constDepth, 1.0f,
			-1.0f, +1.0f, constDepth, 1.0f,
			 0.0f, -1.0f, constDepth, 1.0f,
			 0.0f, +1.0f, constDepth, 1.0f
		};
		const float varyingDepthCoord[] =
		{
			 0.0f, -1.0f, +1.0f, 1.0f,
			 0.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(basicQuadProgram.getProgram());
		gl.uniform4f(gl.getUniformLocation(basicQuadProgram.getProgram(), "u_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.depthFunc(GL_ALWAYS);

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &constDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &varyingDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw base quads");
	}

	// Render with depth test.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.depthFunc(m_compareFunc);
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int		half	= de::clamp((int)((float)referenceFrame.getWidth()*0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	d		= m_evalFunc(Vec2(xf, yf));
			bool	dpass	= compare(m_compareFunc, d, constDepth*0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	xh		= ((float)(x - half) + 0.5f) / (float)(referenceFrame.getWidth()-half);
			float	rd		= 1.0f - (xh + yf) * 0.5f;
			float	d		= m_evalFunc(Vec2(xf, yf));
			bool	dpass	= compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}